

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteBlock.h
# Opt level: O0

void __thiscall Js::ByteBlock::ByteBlock(ByteBlock *this,uint size,ArenaAllocator *alloc)

{
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar1;
  uchar *ptr;
  TrackAllocData local_50;
  nullptr_t local_28;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *local_20;
  ArenaAllocator *alloc_local;
  ByteBlock *pBStack_10;
  uint size_local;
  ByteBlock *this_local;
  
  this->m_contentSize = size;
  local_28 = (nullptr_t)0x0;
  local_20 = &alloc->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  alloc_local._4_4_ = size;
  pBStack_10 = this;
  Memory::WriteBarrierPtr<unsigned_char>::WriteBarrierPtr(&this->m_content,&local_28);
  pAVar1 = local_20;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,(type_info *)&unsigned_char::typeinfo,0,(ulong)alloc_local._4_4_,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/ByteBlock.h"
             ,0x22);
  pAVar1 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo(pAVar1,&local_50);
  ptr = Memory::AllocateArray<Memory::ArenaAllocator,unsigned_char,false>
                  ((Memory *)pAVar1,(ArenaAllocator *)Memory::ArenaAllocator::Alloc,0,
                   (ulong)alloc_local._4_4_);
  Memory::WriteBarrierPtr<unsigned_char>::operator=(&this->m_content,ptr);
  return;
}

Assistant:

ByteBlock(uint size, ArenaAllocator* alloc) : m_contentSize(size), m_content(nullptr)
        {
            m_content = AnewArray(alloc, byte, size);
        }